

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiVertexInputBinding *b)

{
  QRhiVertexInputBinding *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  QDebug *in_stack_ffffffffffffffb8;
  Stream *t;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)t);
  QRhiVertexInputBinding::stride(in_RDX);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff9c);
  QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)t);
  QRhiVertexInputBinding::classification(in_RDX);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff9c);
  QDebug::operator<<(in_stack_ffffffffffffffb8,(char *)t);
  QRhiVertexInputBinding::instanceStepRate(in_RDX);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff9c);
  QDebug::operator<<((QDebug *)in_RDI,(char)(in_stack_ffffffffffffff9c >> 0x18));
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputBinding &b)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputBinding(stride=" << b.stride()
                  << " cls=" << b.classification()
                  << " step-rate=" << b.instanceStepRate()
                  << ')';
    return dbg;
}